

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::decode_next_row(jpeg_decoder *this)

{
  huff_tables *pH;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  short *psVar10;
  int r;
  int extra_bits;
  int local_50;
  int local_4c;
  ulong local_48;
  short *local_40;
  long local_38;
  
  if (0 < this->m_mcus_per_row) {
    iVar5 = this->m_restarts_left;
    local_48 = 0;
    do {
      if ((this->m_restart_interval != 0) && (iVar5 == 0)) {
        process_restart(this);
      }
      if (0 < this->m_blocks_per_mcu) {
        psVar10 = this->m_pMCU_coefficients;
        lVar7 = 0;
        do {
          iVar5 = this->m_mcu_org[lVar7];
          local_40 = this->m_quant[this->m_comp_quant[iVar5]];
          uVar1 = huff_decode(this,this->m_pHuff_tabs[this->m_comp_dc_tab[iVar5]],&local_50);
          iVar2 = local_50;
          if (local_50 < *(int *)(s_extend_test + (ulong)(uVar1 & 0xf) * 4)) {
            iVar2 = local_50 + *(int *)(s_extend_offset + (ulong)(uVar1 & 0xf) * 4);
          }
          uVar3 = iVar2 + this->m_last_dc_val[iVar5];
          this->m_last_dc_val[iVar5] = uVar3;
          *psVar10 = (short)uVar3 * *local_40;
          iVar2 = this->m_mcu_block_max_zag[lVar7];
          pH = this->m_pHuff_tabs[this->m_comp_ac_tab[iVar5]];
          iVar5 = 1;
          local_38 = lVar7;
          do {
            uVar1 = huff_decode(this,pH,&local_4c);
            local_50 = (int)uVar1 >> 4;
            uVar4 = uVar1 & 0xf;
            if (uVar4 == 0) {
              if (local_50 != 0xf) break;
              if (0x30 < iVar5) {
LAB_001211ef:
                stop_decoding(this,JPGD_DECODE_ERROR);
              }
              if (iVar5 < iVar2) {
                iVar9 = iVar2 - iVar5;
                if (0xf < iVar9) {
                  iVar9 = 0x10;
                }
                lVar7 = 0;
                do {
                  psVar10[(int)(&g_ZAG)[lVar7 + iVar5]] = 0;
                  lVar7 = lVar7 + 1;
                } while (iVar9 != (int)lVar7);
              }
              iVar9 = iVar5 + 0xf;
            }
            else {
              iVar9 = iVar5;
              if (0xf < uVar1) {
                iVar9 = local_50 + iVar5;
                if (0x3f < iVar9) goto LAB_001211ef;
                if (iVar5 < iVar2) {
                  iVar6 = iVar2 - iVar5;
                  iVar8 = iVar6;
                  if (local_50 < iVar6) {
                    iVar8 = local_50;
                  }
                  if (iVar8 != 0) {
                    if (local_50 < iVar6) {
                      iVar6 = local_50;
                    }
                    lVar7 = 0;
                    do {
                      psVar10[(int)(&g_ZAG)[lVar7 + iVar5]] = 0;
                      lVar7 = lVar7 + 1;
                    } while (iVar6 != (int)lVar7);
                    iVar9 = iVar5 + local_50;
                  }
                }
              }
              iVar5 = local_4c;
              if (local_4c < *(int *)(s_extend_test + (ulong)uVar4 * 4)) {
                iVar5 = local_4c + *(int *)(s_extend_offset + (ulong)uVar4 * 4);
              }
              psVar10[(int)(&g_ZAG)[iVar9]] = (short)iVar5 * local_40[iVar9];
            }
            iVar5 = iVar9 + 1;
          } while (iVar9 < 0x3f);
          if (iVar5 < iVar2) {
            lVar7 = 0;
            do {
              psVar10[(int)(&g_ZAG)[lVar7 + iVar5]] = 0;
              lVar7 = lVar7 + 1;
            } while ((long)iVar2 - (long)iVar5 != lVar7);
          }
          this->m_mcu_block_max_zag[local_38] = iVar5;
          lVar7 = local_38 + 1;
          psVar10 = psVar10 + 0x40;
        } while (lVar7 < this->m_blocks_per_mcu);
      }
      iVar2 = (int)local_48;
      if (this->m_freq_domain_chroma_upsample == false) {
        transform_mcu(this,iVar2);
      }
      else {
        transform_mcu_expand(this,iVar2);
      }
      iVar5 = this->m_restarts_left + -1;
      this->m_restarts_left = iVar5;
      local_48 = (ulong)(iVar2 + 1U);
    } while ((int)(iVar2 + 1U) < this->m_mcus_per_row);
  }
  return;
}

Assistant:

void jpeg_decoder::decode_next_row() {
  for (int mcu_row = 0; mcu_row < m_mcus_per_row; mcu_row++) {
    if ((m_restart_interval) && (m_restarts_left == 0))
      process_restart();

    jpgd_block_t* p = m_pMCU_coefficients;
    for (int mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++, p += 64) {
      int component_id = m_mcu_org[mcu_block];
      jpgd_quant_t* q = m_quant[m_comp_quant[component_id]];

      int r, s;
      s = huff_decode(m_pHuff_tabs[m_comp_dc_tab[component_id]], r);
      s = JPGD_HUFF_EXTEND(r, s);

      m_last_dc_val[component_id] = (s += m_last_dc_val[component_id]);

      p[0] = static_cast<jpgd_block_t>(s * q[0]);

      int prev_num_set = m_mcu_block_max_zag[mcu_block];

      huff_tables* pH = m_pHuff_tabs[m_comp_ac_tab[component_id]];

      int k;
      for (k = 1; k < 64; k++) {
        int extra_bits;
        s = huff_decode(pH, extra_bits);

        r = s >> 4;
        s &= 15;

        if (s) {
          if (r) {
            if ((k + r) > 63)
              stop_decoding(JPGD_DECODE_ERROR);

            if (k < prev_num_set) {
              int n = JPGD_MIN(r, prev_num_set - k);
              int kt = k;
              while (n--)
                p[g_ZAG[kt++]] = 0;
            }

            k += r;
          }

          s = JPGD_HUFF_EXTEND(extra_bits, s);

          JPGD_ASSERT(k < 64);

          p[g_ZAG[k]] = static_cast<jpgd_block_t>(dequantize_ac(s, q[k]));  //s * q[k];
        } else {
          if (r == 15) {
            if ((k + 16) > 64)
              stop_decoding(JPGD_DECODE_ERROR);

            if (k < prev_num_set) {
              int n = JPGD_MIN(16, prev_num_set - k);
              int kt = k;
              while (n--) {
                JPGD_ASSERT(kt <= 63);
                p[g_ZAG[kt++]] = 0;
              }
            }

            k += 16 - 1;  // - 1 because the loop counter is k
            JPGD_ASSERT(p[g_ZAG[k]] == 0);
          } else
            break;
        }
      }

      if (k < prev_num_set) {
        int kt = k;
        while (kt < prev_num_set)
          p[g_ZAG[kt++]] = 0;
      }

      m_mcu_block_max_zag[mcu_block] = k;
    }

    if (m_freq_domain_chroma_upsample)
      transform_mcu_expand(mcu_row);
    else
      transform_mcu(mcu_row);

    m_restarts_left--;
  }
}